

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint * gf_matr_mul_vector(uint **a,uint rows,uint cols,uint *v,uint len)

{
  bool bVar1;
  uint b;
  uint uVar2;
  uint *puVar3;
  uint local_3c;
  uint _k;
  uint j;
  uint i;
  uint *c;
  uint len_local;
  uint *v_local;
  uint cols_local;
  uint rows_local;
  uint **a_local;
  
  if (rows != len) {
    fatal((uchar *)"gf_matr_mul_vector",(uchar *)"rows != vector rows\n");
  }
  puVar3 = vector_new(rows);
  for (_k = 0; _k < rows; _k = _k + 1) {
    bVar1 = false;
    while (!bVar1) {
      puVar3[_k] = 0;
      for (local_3c = 0; local_3c < len; local_3c = local_3c + 1) {
        uVar2 = puVar3[_k];
        b = gf_mul(a[_k][local_3c],v[local_3c]);
        uVar2 = gf_sum(uVar2,b);
        puVar3[_k] = uVar2;
      }
      bVar1 = true;
    }
  }
  return puVar3;
}

Assistant:

uint32_t *gf_matr_mul_vector(uint32_t **a, uint32_t rows, uint32_t cols, uint32_t* v, uint32_t len){
    if(rows != len)
        fatal("gf_matr_mul_vector", "rows != vector rows\n");

    uint32_t *c = vector_new(rows);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < 1; j++)
        {
            c[i] = 0;
            for (uint32_t _k = 0; _k < len; _k++)
                c[i] = gf_sum(c[i], gf_mul(a[i][_k], v[_k]));
        }

    return c;
}